

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall
google::protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
          (Printer *this,char *begin_varname,char *end_varname,FieldDescriptor *descriptor)

{
  vector<int,_std::allocator<int>_> path;
  
  if (*(long *)(this + 0x98) != 0) {
    google::protobuf::FieldDescriptor::GetLocationPath((vector *)descriptor);
    google::protobuf::io::Printer::Annotate
              ((char *)this,begin_varname,(string *)end_varname,
               (vector *)**(undefined8 **)(descriptor + 0x28));
  }
  return;
}

Assistant:

void Annotate(const char* begin_varname, const char* end_varname,
                const SomeDescriptor* descriptor) {
    if (annotation_collector_ == NULL) {
      // Annotations aren't turned on for this Printer, so don't pay the cost
      // of building the location path.
      return;
    }
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    Annotate(begin_varname, end_varname, descriptor->file()->name(), path);
  }